

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire.hpp
# Opt level: O1

string * __thiscall wire::string::operator=(string *this,char **t)

{
  size_t sVar1;
  char *__s;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  __s = "";
  if (*t != (char *)0x0) {
    __s = *t;
  }
  local_40[0] = local_30;
  sVar1 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,__s,__s + sVar1);
  std::__cxx11::string::operator=((string *)this,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return this;
}

Assistant:

string &operator=( const T &t )
        {
            this->assign( string(t) );
            return *this;
        }